

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_TryMove(AActor *thing,DVector2 *pos,int dropoff,secplane_t *onfloor,FCheckPosition *tm,
              bool missileCheck)

{
  byte *pbVar1;
  TObjPtr<ASectorAction> *obj;
  DVector2 *pDVar2;
  double *pdVar3;
  DAngle angle;
  double dVar4;
  uint uVar5;
  uint uVar6;
  line_t_conflict *line;
  sector_t *psVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  bool bVar13;
  spechit_t *psVar14;
  msecnode_t *line_00;
  bool bVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  AActor *pAVar19;
  DBot *pDVar20;
  DBot *pDVar21;
  ASectorAction *pAVar22;
  sector_t_conflict *psVar23;
  ulong uVar24;
  line_t_conflict *src;
  undefined7 in_register_00000089;
  FLinePortal *pFVar25;
  long lVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar30;
  FLinkContext ctx;
  double local_f8;
  DVector2 DStack_f0;
  sector_t *local_e0;
  DVector2 *local_d8;
  uint local_cc;
  undefined1 local_c8 [16];
  FLinkContext ctx_1;
  FLinkContext ctx_3;
  FName local_6c;
  msecnode_t *local_68;
  msecnode_t *pmStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  
  src = (line_t_conflict *)(CONCAT71(in_register_00000089,missileCheck) & 0xffffffff);
  local_e0 = thing->Sector;
  tm->floatok = false;
  tm->portalstep = false;
  angle.Degrees = (thing->__Pos).Z;
  if (onfloor != (secplane_t *)0x0) {
    dVar10 = secplane_t::ZatPoint(onfloor,pos);
    (thing->__Pos).Z = dVar10;
  }
  pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar1 = *pbVar1 | 0x10;
  bVar15 = P_CheckPosition(thing,pos,tm,false);
  if (bVar15) {
LAB_00415e65:
    uVar5 = (thing->flags3).Value;
    if ((uVar5 & 1) == 0) {
      if ((uVar5 & 2) != 0) {
        dVar10 = tm->ceilingz - thing->Height;
        goto LAB_00415f8c;
      }
    }
    else {
      dVar10 = tm->floorz;
LAB_00415f8c:
      (thing->__Pos).Z = dVar10;
    }
    if ((onfloor != (secplane_t *)0x0) && (tm->floorsector == thing->floorsector)) {
      (thing->__Pos).Z = tm->floorz;
    }
    uVar6 = (thing->flags).Value;
    if ((uVar6 >> 0xc & 1) != 0) {
LAB_0041638a:
      psVar7 = local_e0;
      if (thing->player == (player_t *)0x0) {
        dVar10 = thing->Height * 0.5;
      }
      else {
        dVar10 = thing->player->viewheight;
      }
      local_d8 = pos;
      if (local_e0->heightsec == (sector_t *)0x0) {
        bVar13 = true;
        bVar15 = true;
      }
      else {
        dVar30 = secplane_t::ZatPoint(&local_e0->heightsec->floorplane,thing);
        bVar15 = angle.Degrees + dVar10 <= dVar30;
        dVar30 = secplane_t::ZatPoint(&psVar7->heightsec->ceilingplane,thing);
        bVar13 = angle.Degrees + dVar10 <= dVar30;
      }
      if ((((((thing->BounceFlags).Value & 0x1000) != 0) && (((thing->flags).Value & 0x10200) == 0))
          && (bVar16 = AActor::IsSentient(thing), !bVar16)) &&
         (16.0 < tm->floorz - (thing->__Pos).Z)) goto LAB_00416d23;
      bVar16 = false;
      do {
        lVar26 = 0x18;
        local_c8 = ZEXT816(0x3ff199999999999a);
        for (uVar24 = 0; psVar14 = portalhit.Array, uVar24 < portalhit.Count; uVar24 = uVar24 + 1) {
          line = *(line_t_conflict **)((long)portalhit.Array + lVar26 + -0x18);
          if (line->frontsector->PortalGroup == thing->Sector->PortalGroup) {
            pDVar2 = (DVector2 *)((long)&(portalhit.Array)->line + lVar26);
            iVar17 = P_PointOnLineSide((DVector2 *)((long)portalhit.Array + lVar26 + -0x10),line);
            iVar18 = P_PointOnLineSide(pDVar2,line);
            if ((iVar17 == 0) && (iVar18 == 1)) {
              ctx = *(FLinkContext *)&line->v1->p;
              local_f8 = (line->delta).X;
              DStack_f0.X = (line->delta).Y;
              ctx_3.sector_list = (msecnode_t *)pDVar2[-1].X;
              ctx_3.render_list = (msecnode_t *)pDVar2[-1].Y;
              dVar30 = P_InterceptVector((divline_t *)&ctx_3,(divline_t *)&ctx);
              if (dVar30 < (double)local_c8._0_8_) {
                src = *(line_t_conflict **)((long)psVar14 + lVar26 + -0x18);
                pdVar3 = (double *)((long)psVar14 + lVar26 + -0x10);
                local_48 = *pdVar3;
                dStack_40 = pdVar3[1];
                pdVar3 = (double *)((long)&psVar14->line + lVar26);
                local_58 = *pdVar3;
                dStack_50 = pdVar3[1];
                local_cc = (uint)uVar24;
                local_c8._8_4_ = extraout_XMM0_Dc;
                local_c8._0_8_ = dVar30;
                local_c8._12_4_ = extraout_XMM0_Dd;
              }
            }
          }
          lVar26 = lVar26 + 0x28;
        }
        if (1.1 <= (double)local_c8._0_8_) break;
        TArray<spechit_t,_spechit_t>::Delete(&portalhit,local_cc);
        pFVar25 = linePortals.Array + src->portalindex;
        if (linePortals.Count <= src->portalindex) {
          pFVar25 = (FLinePortal *)0x0;
        }
        if (pFVar25->mType == '\x03') {
          ctx = (FLinkContext)ZEXT816(0);
          AActor::UnlinkFromWorld(thing,&ctx);
          dVar4 = (pFVar25->mDisplacement).X;
          dVar12 = (pFVar25->mDisplacement).Y;
          dVar30 = (tm->pos).X + dVar4;
          dVar11 = (tm->pos).Y + dVar12;
          auVar8._8_4_ = SUB84(dVar11,0);
          auVar8._0_8_ = dVar30;
          auVar8._12_4_ = (int)((ulong)dVar11 >> 0x20);
          (thing->__Pos).X = dVar30;
          (thing->__Pos).Y = (double)auVar8._8_8_;
          dVar4 = (thing->Prev).X + dVar4;
          dVar12 = (thing->Prev).Y + dVar12;
          auVar9._8_4_ = SUB84(dVar12,0);
          auVar9._0_8_ = dVar4;
          auVar9._12_4_ = (int)((ulong)dVar12 >> 0x20);
          (thing->Prev).X = dVar4;
          (thing->Prev).Y = (double)auVar9._8_8_;
          AActor::LinkToWorld(thing,&ctx,false,(sector_t *)0x0);
          P_FindFloorCeiling(thing,0);
          tm->portalstep = false;
          bVar16 = true;
        }
        else if (!bVar16) {
          dVar30 = (thing->__Pos).Z;
          ctx.sector_list = (msecnode_t *)(tm->pos).X;
          ctx.render_list = (msecnode_t *)(tm->pos).Y;
          ctx_3.sector_list = (msecnode_t *)(thing->__Pos).X;
          ctx_3.render_list = (msecnode_t *)(thing->__Pos).Y;
          local_f8 = dVar30;
          local_68 = ctx_3.sector_list;
          pmStack_60 = ctx_3.render_list;
          P_TranslatePortalXY(src,(double *)&ctx,(double *)&ctx.render_list);
          P_TranslatePortalXY(src,(double *)&ctx_3,(double *)&ctx_3.render_list);
          P_TranslatePortalZ(src,&local_f8);
          (thing->__Pos).Z = local_f8;
          (thing->__Pos).X = (double)ctx_3.sector_list;
          (thing->__Pos).Y = (double)ctx_3.render_list;
          ctx_1.sector_list = ctx.sector_list;
          ctx_1.render_list = ctx.render_list;
          bVar16 = P_CheckPosition(thing,(DVector2 *)&ctx_1,true);
          if (!bVar16) {
            (thing->__Pos).Z = dVar30;
            (thing->__Pos).X = (double)local_68;
            (thing->__Pos).Y = (double)pmStack_60;
            goto LAB_00416d23;
          }
          ctx_1.sector_list = (msecnode_t *)0x0;
          ctx_1.render_list = (msecnode_t *)0x0;
          AActor::UnlinkFromWorld(thing,&ctx_1);
          (thing->__Pos).Z = local_f8;
          (thing->__Pos).X = (double)ctx.sector_list;
          (thing->__Pos).Y = (double)ctx.render_list;
          P_TranslatePortalVXVY(src,&(thing->Vel).X,&(thing->Vel).Y);
          P_TranslatePortalAngle(src,&(thing->Angles).Yaw);
          AActor::LinkToWorld(thing,&ctx_1,false,(sector_t *)0x0);
          P_FindFloorCeiling(thing,0);
          AActor::ClearInterpolation(thing);
          tm->portalstep = false;
          bVar16 = true;
        }
        pAVar19 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
        if (pAVar19 == thing) {
          ctx.render_list =
               (msecnode_t *)((double)local_c8._0_8_ * (dStack_50 - dStack_40) + dStack_40);
          ctx.sector_list =
               (msecnode_t *)((double)local_c8._0_8_ * (local_58 - local_48) + local_48);
          local_f8 = 0.0;
          DStack_f0.X = 0.0;
          R_AddInterpolationPoint((DVector3a *)&ctx);
          if (pFVar25->mType == '\x03') {
            dVar30 = (pFVar25->mDisplacement).Y + (double)ctx.render_list;
            ctx.render_list._0_4_ = SUB84(dVar30,0);
            ctx.sector_list = (msecnode_t *)((pFVar25->mDisplacement).X + (double)ctx.sector_list);
            ctx.render_list._4_4_ = (int)((ulong)dVar30 >> 0x20);
          }
          else {
            P_TranslatePortalXY(src,(double *)&ctx,(double *)&ctx.render_list);
            P_TranslatePortalZ(src,&local_f8);
            *(double *)(&DAT_017dbfe0 + (long)consoleplayer * 0x2a0) =
                 local_f8 + *(double *)(&DAT_017dbfe0 + (long)consoleplayer * 0x2a0);
            P_TranslatePortalAngle(src,(DAngle *)&DStack_f0);
          }
          R_AddInterpolationPoint((DVector3a *)&ctx);
        }
      } while (pFVar25->mType == '\x03');
      if (!bVar16) {
        ctx = (FLinkContext)ZEXT816(0);
        AActor::UnlinkFromWorld(thing,&ctx);
        dVar30 = tm->ceilingz;
        thing->floorz = tm->floorz;
        thing->ceilingz = dVar30;
        thing->dropoffz = tm->dropoffz;
        (thing->floorpic).texnum = (tm->floorpic).texnum;
        thing->floorterrain = tm->floorterrain;
        thing->floorsector = tm->floorsector;
        (thing->ceilingpic).texnum = (tm->ceilingpic).texnum;
        thing->ceilingsector = tm->ceilingsector;
        dVar30 = local_d8->Y;
        (thing->__Pos).X = local_d8->X;
        (thing->__Pos).Y = dVar30;
        AActor::LinkToWorld(thing,&ctx,false,(sector_t *)0x0);
      }
      if (((thing->flags2).Value & 0x20) != 0) {
        AActor::AdjustFloorClip(thing);
      }
      if (((thing->flags).Value & 0x9000) == 0) {
LAB_004169b6:
        bVar16 = TArray<spechit_t,_spechit_t>::Pop(&spechit,(spechit_t *)&ctx);
        if (bVar16) {
          line_00 = ctx.sector_list;
          iVar17 = P_PointOnLineSide(&DStack_f0,(line_t_conflict *)ctx.sector_list);
          iVar18 = P_PointOnLineSide((DVector2 *)&ctx.render_list,(line_t_conflict *)line_00);
          if (((iVar17 != iVar18) && (iVar17 = *(int *)&line_00->m_snext, iVar17 != 0)) &&
             (((thing->flags6).Value & 0x10000) == 0)) {
            if (thing->player == (player_t *)0x0) {
              uVar5 = (thing->flags2).Value;
              if ((uVar5 >> 0x17 & 1) == 0) {
                if ((uVar5 >> 0x18 & 1) == 0) {
                  if ((iVar17 - 0x46U < 2) || (iVar17 == 0xd7)) goto LAB_00416a70;
                  iVar17 = 0x80;
                }
                else {
                  iVar17 = 0x20;
                }
              }
              else {
LAB_00416a70:
                iVar17 = 4;
              }
            }
            else {
              if ((thing->player->cheats & 0x2000) != 0) {
                P_PredictLine((line_t_conflict *)line_00,thing,iVar18,1);
                goto LAB_004169b6;
              }
              iVar17 = 1;
            }
            P_ActivateLine((line_t_conflict *)line_00,thing,iVar18,iVar17,(DVector3 *)0x0);
          }
          goto LAB_004169b6;
        }
      }
      if ((thing->player != (player_t *)0x0) && ((thing->player->cheats & 0x2000) != 0))
      goto LAB_00416cc5;
      psVar7 = thing->Sector;
      if ((psVar7->heightsec != (sector_t *)0x0) && (local_e0->heightsec != (sector_t *)0x0)) {
        obj = &psVar7->SecActTarget;
        pAVar22 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
        if (pAVar22 != (ASectorAction *)0x0) {
          psVar7 = psVar7->heightsec;
          dVar10 = dVar10 + (thing->__Pos).Z;
          dVar30 = secplane_t::ZatPoint(&psVar7->floorplane,local_d8);
          iVar17 = 0x80;
          if ((bool)(bVar15 & dVar30 < dVar10)) {
LAB_00416b54:
            pAVar22 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
            ASectorAction::TriggerAction(pAVar22,thing,iVar17);
          }
          else if (!bVar15 && dVar10 <= dVar30) {
            iVar17 = 0x40;
            goto LAB_00416b54;
          }
          if ((psVar7->MoreFlags & 2) == 0) {
            dVar30 = secplane_t::ZatPoint(&psVar7->ceilingplane,local_d8);
            iVar17 = 0x200;
            if (((bool)(bVar13 & dVar30 < dVar10)) || (iVar17 = 0x100, !bVar13 && dVar10 <= dVar30))
            {
              pAVar22 = GC::ReadBarrier<ASectorAction>((ASectorAction **)obj);
              ASectorAction::TriggerAction(pAVar22,thing,iVar17);
            }
          }
        }
      }
      if (tm->portalstep == true) {
        ctx_3.sector_list = (msecnode_t *)0x0;
        ctx_3.render_list = (msecnode_t *)0x0;
        dVar10 = (thing->__Pos).Z;
        dVar30 = (thing->__Pos).X;
        dVar4 = (thing->__Pos).Y;
        AActor::UnlinkFromWorld(thing,&ctx_3);
        AActor::PosRelative((DVector3 *)&ctx,thing,
                            (sectorPortals.Array[thing->Sector->Portals[1]].mDestination)->
                            PortalGroup);
        (thing->__Pos).Z = local_f8;
        (thing->__Pos).X = (double)ctx.sector_list;
        (thing->__Pos).Y = (double)ctx.render_list;
        (thing->Prev).Z = local_f8 - dVar10;
        (thing->Prev).X = (double)ctx.sector_list - dVar30;
        (thing->Prev).Y = (double)ctx.render_list - dVar4;
        psVar23 = P_PointInSector((DVector2 *)&ctx);
        thing->Sector = (sector_t *)psVar23;
        thing->PrevPortalGroup = psVar23->PortalGroup;
        AActor::LinkToWorld(thing,&ctx_3,false,(sector_t *)0x0);
        P_FindFloorCeiling(thing,0);
      }
      AActor::CheckSectorTransition(thing,local_e0);
LAB_00416cc5:
      pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
      *pbVar1 = *pbVar1 & 0xef;
      return true;
    }
    dVar10 = tm->floorz;
    dVar30 = tm->ceilingz;
    dVar4 = thing->Height;
    if (dVar30 - dVar10 < dVar4) {
LAB_00415fed:
      pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
      *pbVar1 = *pbVar1 & 0xef;
      if (((thing->player == (player_t *)0x0) || ((thing->player->cheats & 0x2000) == 0)) &&
         ((thing->__Pos).Z = angle.Degrees, ((thing->flags).Value & 0x9000) == 0)) {
        pAVar19 = tm->thing;
        if (((pAVar19->flags2).Value & 8) != 0) {
          local_6c.Index = 0x89;
          local_38 = 0;
          P_DamageMobj(pAVar19,(AActor *)0x0,(AActor *)0x0,pAVar19->Mass >> 5,&local_6c,0,angle);
        }
        uVar24 = (ulong)spechit.Count;
        lVar26 = uVar24 * 0x28 + -0x10;
        for (; psVar14 = spechit.Array, 0 < (int)uVar24; uVar24 = (ulong)((int)uVar24 - 1)) {
          pDVar2 = (DVector2 *)((long)&(spechit.Array)->line + lVar26);
          iVar17 = P_PointOnLineSide(pDVar2,*(line_t_conflict **)
                                             ((long)spechit.Array + lVar26 + -0x18));
          CheckForPushSpecial(*(line_t **)((long)psVar14 + lVar26 + -0x18),iVar17,thing,pDVar2);
          lVar26 = lVar26 + -0x28;
        }
      }
      return false;
    }
    tm->floatok = true;
    if ((((((uVar6 & 0x8000) == 0) && ((uVar5 & 2) == 0)) && (dVar30 < (thing->__Pos).Z + dVar4)) &&
        (((uVar6 >> 9 & 1) == 0 || (((thing->flags2).Value & 0x10) == 0)))) ||
       (((uVar6 >> 9 & 1) != 0 &&
        ((((thing->flags2).Value & 0x10) != 0 && (dVar30 < dVar4 + (thing->__Pos).Z))))))
    goto LAB_00415fed;
    if ((uVar5 & 1) == 0 && (uVar6 & 0x8000) == 0) {
      if ((uVar6 >> 0x10 & 1) == 0) {
        dVar30 = (thing->__Pos).Z;
      }
      else {
        dVar30 = (thing->__Pos).Z;
        if ((((thing->flags6).Value & 0x80) == 0) && (dVar30 < dVar10)) goto LAB_00415fed;
      }
      if (thing->MaxStepHeight <= dVar10 - dVar30 && dVar10 - dVar30 != thing->MaxStepHeight)
      goto LAB_00415fed;
      if (dVar30 < dVar10) {
        (thing->__Pos).Z = dVar10;
        bVar15 = P_TestMobjZ(thing,true,(AActor **)0x0);
        (thing->__Pos).Z = dVar30;
        if (!bVar15) goto LAB_00415fed;
        if ((((thing->flags6).Value & 0x80) != 0) &&
           ((thing->__Pos).Z = tm->floorz, pdVar3 = &(thing->Vel).Z,
           *pdVar3 <= 0.0 && *pdVar3 != 0.0)) {
          if (((thing->BounceFlags).Value & 2) == 0) {
            (thing->Vel).Z = 0.0;
          }
          else {
            AActor::FloorBounceMissile(thing,&tm->floorsector->floorplane);
          }
        }
      }
    }
    if ((((i_compatflags & 0x100000U) == 0) || (((thing->flags4).Value & 0x80000) != 0)) &&
       (dropoff != 0)) {
      if (dropoff == 2) {
        if (tm->floorz - tm->dropoffz <= 128.0) {
          pAVar19 = GC::ReadBarrier<AActor>((AActor **)&thing->target);
          if ((pAVar19 != (AActor *)0x0) &&
             (pAVar19 = GC::ReadBarrier<AActor>((AActor **)&thing->target),
             dVar10 = (pAVar19->__Pos).Z, dVar10 < tm->dropoffz || dVar10 == tm->dropoffz))
          goto LAB_00416199;
        }
        goto LAB_00416187;
      }
LAB_00416199:
      uVar5 = (thing->flags5).Value;
      if ((uVar5 & 4) != 0) goto LAB_0041625e;
    }
    else {
LAB_00416187:
      if (((thing->flags).Value & 0x14400) != 0) goto LAB_00416199;
      uVar5 = (thing->flags5).Value;
LAB_0041625e:
      if ((uVar5 & 0x20) == 0) {
        dVar10 = tm->floorz;
        uVar28 = (undefined4)((ulong)dVar10 >> 0x20);
        uVar5 = (thing->flags2).Value;
        uVar27 = SUB84(dVar10,0);
        uVar29 = uVar28;
        if ((uVar5 >> 0xb & 1) != 0) {
          dVar30 = (thing->__Pos).Z;
          uVar27 = SUB84(dVar30,0);
          uVar29 = (int)((ulong)dVar30 >> 0x20);
          if (dVar30 <= dVar10) {
            uVar27 = SUB84(dVar10,0);
            uVar29 = uVar28;
          }
        }
        dVar10 = (double)CONCAT44(uVar29,uVar27) - tm->dropoffz;
        if ((thing->MaxDropOffHeight <= dVar10 && dVar10 != thing->MaxDropOffHeight) &&
           ((char)((uVar5 & 8) >> 3) == '\0' && (char)src == '\0')) goto LAB_00416d17;
      }
      else if ((thing->MaxDropOffHeight < thing->floorz - tm->floorz) ||
              (thing->MaxDropOffHeight < thing->dropoffz - tm->dropoffz)) goto LAB_00416d23;
    }
    if ((((thing->flags2).Value & 0x2000000) == 0) ||
       ((((tm->floorpic).texnum == (thing->floorpic).texnum &&
         (dVar10 = tm->floorz - (thing->__Pos).Z, dVar10 == 0.0)) && (!NAN(dVar10))))) {
      if (((thing->player == (player_t *)0x0) ||
          (pDVar20 = GC::ReadBarrier<DBot>((DBot **)&thing->player->Bot), pDVar20 == (DBot *)0x0))
         || ((((thing->flags).Value & 4) == 0 ||
             ((tm->sector == thing->Sector ||
              (bVar15 = FCajunMaster::IsDangerous(&bglobal,tm->sector), !bVar15))))))
      goto LAB_0041638a;
      pDVar20 = GC::ReadBarrier<DBot>((DBot **)&thing->player->Bot);
      pDVar21 = GC::ReadBarrier<DBot>((DBot **)&thing->player->Bot);
      (pDVar21->prev).field_0 = (pDVar20->dest).field_0;
      pDVar20 = GC::ReadBarrier<DBot>((DBot **)&thing->player->Bot);
      (pDVar20->dest).field_0.p = (AActor *)0x0;
      (thing->Vel).X = 0.0;
      (thing->Vel).Y = 0.0;
    }
  }
  else {
    pAVar19 = thing->BlockingMobj;
    if ((((pAVar19 == (AActor *)0x0) || (pAVar19->player != (player_t *)0x0)) ||
        (thing->player == (player_t *)0x0)) ||
       (dVar10 = ((pAVar19->__Pos).Z + pAVar19->Height) - (thing->__Pos).Z,
       thing->MaxStepHeight <= dVar10 && dVar10 != thing->MaxStepHeight)) goto LAB_00415fed;
    dVar10 = secplane_t::ZatPoint(&pAVar19->Sector->ceilingplane,pos);
    dVar30 = (pAVar19->__Pos).Z + pAVar19->Height;
    if (((dVar10 - dVar30 < thing->Height) && ((pAVar19->Sector->planes[1].Flags & 0x1d0U) != 0x100)
        ) || (tm->ceilingz - dVar30 < thing->Height)) goto LAB_00415fed;
    if ((((tm->thing->flags2).Value & 0x1000) != 0) && ((i_compatflags & 0x10U) == 0))
    goto LAB_00415e65;
  }
LAB_00416d17:
  (thing->__Pos).Z = angle.Degrees;
LAB_00416d23:
  pbVar1 = (byte *)((long)&(thing->flags6).Value + 3);
  *pbVar1 = *pbVar1 & 0xef;
  return false;
}

Assistant:

bool P_TryMove(AActor *thing, const DVector2 &pos,
	int dropoff, // killough 3/15/98: allow dropoff as option
	const secplane_t *onfloor, // [RH] Let P_TryMove keep the thing on the floor
	FCheckPosition &tm,
	bool missileCheck)	// [GZ] Fired missiles ignore the drop-off test
{
	sector_t	*oldsector;
	double		oldz;
	int 		side;
	int 		oldside;
	sector_t*	oldsec = thing->Sector;	// [RH] for sector actions
	sector_t*	newsec;

	tm.floatok = false;
	tm.portalstep = false;
	oldz = thing->Z();
	if (onfloor)
	{
		thing->SetZ(onfloor->ZatPoint(pos));
	}
	thing->flags6 |= MF6_INTRYMOVE;
	if (!P_CheckPosition(thing, pos, tm))
	{
		AActor *BlockingMobj = thing->BlockingMobj;
		// Solid wall or thing
		if (!BlockingMobj || BlockingMobj->player || !thing->player)
		{
			goto pushline;
		}
		else
		{
			if (BlockingMobj->player || !thing->player)
			{
				goto pushline;
			}
			else if (BlockingMobj->Top() - thing->Z() > thing->MaxStepHeight
				|| ((BlockingMobj->Sector->ceilingplane.ZatPoint(pos) - (BlockingMobj->Top()) < thing->Height) && BlockingMobj->Sector->PortalBlocksMovement(sector_t::ceiling))
				|| (tm.ceilingz - (BlockingMobj->Top()) < thing->Height))
			{
				goto pushline;
			}
		}
		if (!(tm.thing->flags2 & MF2_PASSMOBJ) || (i_compatflags & COMPATF_NO_PASSMOBJ))
		{
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}
	}

	if (thing->flags3 & MF3_FLOORHUGGER)
	{
		thing->SetZ(tm.floorz);
	}
	else if (thing->flags3 & MF3_CEILINGHUGGER)
	{
		thing->SetZ(tm.ceilingz - thing->Height);
	}

	if (onfloor && tm.floorsector == thing->floorsector)
	{
		thing->SetZ(tm.floorz);
	}
	if (!(thing->flags & MF_NOCLIP))
	{
		if (tm.ceilingz - tm.floorz < thing->Height)
		{
			goto pushline;		// doesn't fit
		}

		tm.floatok = true;

		if (!(thing->flags & MF_TELEPORT)
			&& tm.ceilingz < thing->Top()
			&& !(thing->flags3 & MF3_CEILINGHUGGER)
			&& (!(thing->flags2 & MF2_FLY) || !(thing->flags & MF_NOGRAVITY)))
		{
			goto pushline;		// mobj must lower itself to fit
		}
		if (thing->flags2 & MF2_FLY && thing->flags & MF_NOGRAVITY)
		{
#if 1
			if (thing->Top() > tm.ceilingz)
				goto pushline;
#else
			// When flying, slide up or down blocking lines until the actor
			// is not blocked.
			if (thing->Top() > tm.ceilingz)
			{
				thing->Vel.Z = -8;
				goto pushline;
			}
			else if (thing->Z() < tm.floorz && tm.floorz - tm.dropoffz > thing->MaxDropOffHeight)
			{
				thing->Vel.Z = 8;
				goto pushline;
			}
#endif
		}
		if (!(thing->flags & MF_TELEPORT) && !(thing->flags3 & MF3_FLOORHUGGER))
		{
			if ((thing->flags & MF_MISSILE) && !(thing->flags6 & MF6_STEPMISSILE) && tm.floorz > thing->Z())
			{ // [RH] Don't let normal missiles climb steps
				goto pushline;
			}
			if (tm.floorz - thing->Z() > thing->MaxStepHeight)
			{ // too big a step up
				goto pushline;
			}
			else if (thing->Z() < tm.floorz)
			{ // [RH] Check to make sure there's nothing in the way for the step up
				double savedz = thing->Z();
				bool good;
				thing->SetZ(tm.floorz);
				good = P_TestMobjZ(thing);
				thing->SetZ(savedz);
				if (!good)
				{
					goto pushline;
				}
				if (thing->flags6 & MF6_STEPMISSILE)
				{
					thing->SetZ(tm.floorz);
					// If moving down, cancel vertical component of the velocity
					if (thing->Vel.Z < 0)
					{
						// If it's a bouncer, let it bounce off its new floor, too.
						if (thing->BounceFlags & BOUNCE_Floors)
						{
							thing->FloorBounceMissile(tm.floorsector->floorplane);
						}
						else
						{
							thing->Vel.Z = 0;
						}
					}
				}
			}
		}

		// compatibility check: Doom originally did not allow monsters to cross dropoffs at all.
		// If the compatibility flag is on, only allow this when the velocity comes from a scroller
		if ((i_compatflags & COMPATF_CROSSDROPOFF) && !(thing->flags4 & MF4_SCROLLMOVE))
		{
			dropoff = false;
		}

		if (dropoff == 2 &&  // large jump down (e.g. dogs)
			(tm.floorz - tm.dropoffz > 128. || thing->target == NULL || thing->target->Z() >tm.dropoffz))
		{
			dropoff = false;
		}


		// killough 3/15/98: Allow certain objects to drop off
		if ((!dropoff && !(thing->flags & (MF_DROPOFF | MF_FLOAT | MF_MISSILE))) || (thing->flags5&MF5_NODROPOFF))
		{
			if (!(thing->flags5&MF5_AVOIDINGDROPOFF))
			{
				double floorz = tm.floorz;
				// [RH] If the thing is standing on something, use its current z as the floorz.
				// This is so that it does not walk off of things onto a drop off.
				if (thing->flags2 & MF2_ONMOBJ)
				{
					floorz = MAX(thing->Z(), tm.floorz);
				}

				if (floorz - tm.dropoffz > thing->MaxDropOffHeight &&
					!(thing->flags2 & MF2_BLASTED) && !missileCheck)
				{ // Can't move over a dropoff unless it's been blasted
					// [GZ] Or missile-spawned
					thing->SetZ(oldz);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
			else
			{
				// special logic to move a monster off a dropoff
				// this intentionally does not check for standing on things.
				if (thing->floorz - tm.floorz > thing->MaxDropOffHeight ||
					thing->dropoffz - tm.dropoffz > thing->MaxDropOffHeight)
				{
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
			}
		}
		if (thing->flags2 & MF2_CANTLEAVEFLOORPIC
			&& (tm.floorpic != thing->floorpic
			|| tm.floorz - thing->Z() != 0))
		{ // must stay within a sector of a certain floor type
			thing->SetZ(oldz);
			thing->flags6 &= ~MF6_INTRYMOVE;
			return false;
		}

		//Added by MC: To prevent bot from getting into dangerous sectors.
		if (thing->player && thing->player->Bot != NULL && thing->flags & MF_SHOOTABLE)
		{
			if (tm.sector != thing->Sector
				&& bglobal.IsDangerous(tm.sector))
			{
				thing->player->Bot->prev = thing->player->Bot->dest;
				thing->player->Bot->dest = NULL;
				thing->Vel.X = thing->Vel.Y = 0;
				thing->SetZ(oldz);
				thing->flags6 &= ~MF6_INTRYMOVE;
				return false;
			}
		}
	}

	// [RH] Check status of eyes against fake floor/ceiling in case
	// it slopes or the player's eyes are bobbing in and out.

	bool oldAboveFakeFloor, oldAboveFakeCeiling;
	double viewheight;
	// pacify GCC
	viewheight = thing->player ? thing->player->viewheight : thing->Height / 2;
	oldAboveFakeFloor = oldAboveFakeCeiling = false;

	if (oldsec->heightsec)
	{
		double eyez = oldz + viewheight;

		oldAboveFakeFloor = eyez > oldsec->heightsec->floorplane.ZatPoint(thing);
		oldAboveFakeCeiling = eyez > oldsec->heightsec->ceilingplane.ZatPoint(thing);
	}

	// Borrowed from MBF: 
	if (thing->BounceFlags & BOUNCE_MBF &&  // killough 8/13/98
		!(thing->flags & (MF_MISSILE | MF_NOGRAVITY)) &&
		!thing->IsSentient() && tm.floorz - thing->Z() > 16)
	{ // too big a step up for MBF bouncers under gravity
		thing->flags6 &= ~MF6_INTRYMOVE;
		return false;
	}


	// Check for crossed portals
	bool portalcrossed;
	portalcrossed = false;

	while (true)
	{
		double bestfrac = 1.1;
		spechit_t besthit;
		int besthitnum;
		// find the portal nearest to the crossing actor
		for (unsigned i = 0; i < portalhit.Size();i++)
		{
			auto &spec = portalhit[i];

			line_t *ld = spec.line;
			if (ld->frontsector->PortalGroup != thing->Sector->PortalGroup) continue;	// must be in the same group to be considered valid.

			// see if the line was crossed
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			side = P_PointOnLineSide(spec.Refpos, ld);
			if (oldside == 0 && side == 1)
			{
				divline_t dl2 = { ld->v1->fX(), ld->v1->fY(), ld->Delta().X, ld->Delta().Y };
				divline_t dl1 = { spec.Oldrefpos.X, spec.Oldrefpos.Y, spec.Refpos.X - spec.Oldrefpos.X, spec.Refpos.Y - spec.Oldrefpos.Y };
				double frac = P_InterceptVector(&dl1, &dl2);
				if (frac < bestfrac)
				{
					besthit = spec;
					bestfrac = frac;
					besthitnum = i;
				}
			}
		}

		if (bestfrac < 1.1)
		{
			portalhit.Delete(besthitnum);
			line_t *ld = besthit.line;
			FLinePortal *port = ld->getPortal();
			if (port->mType == PORTT_LINKED)
			{
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXY(tm.pos + port->mDisplacement);
				thing->Prev += port->mDisplacement;
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				portalcrossed = true;
				tm.portalstep = false;
			}
			else if (!portalcrossed)
			{
				DVector3 pos(tm.pos, thing->Z());
				DVector3 oldthingpos = thing->Pos();
				DVector2 thingpos = oldthingpos;
				
				P_TranslatePortalXY(ld, pos.X, pos.Y);
				P_TranslatePortalXY(ld, thingpos.X, thingpos.Y);
				P_TranslatePortalZ(ld, pos.Z);
				thing->SetXYZ(thingpos.X, thingpos.Y, pos.Z);
				if (!P_CheckPosition(thing, pos, true))	// check if some actor blocks us on the other side. (No line checks, because of the mess that'd create.)
				{
					thing->SetXYZ(oldthingpos);
					thing->flags6 &= ~MF6_INTRYMOVE;
					return false;
				}
				FLinkContext ctx;
				thing->UnlinkFromWorld(&ctx);
				thing->SetXYZ(pos);
				P_TranslatePortalVXVY(ld, thing->Vel.X, thing->Vel.Y);
				P_TranslatePortalAngle(ld, thing->Angles.Yaw);
				thing->LinkToWorld(&ctx);
				P_FindFloorCeiling(thing);
				thing->ClearInterpolation();
				portalcrossed = true;
				tm.portalstep = false;
			}
			// if this is the current camera we need to store the point where the portal was crossed and the exit
			// so that the renderer can properly calculate an interpolated position along the movement path.
			if (thing == players[consoleplayer].camera)
			{
				divline_t dl1 = { besthit.Oldrefpos.X,besthit.Oldrefpos.Y, besthit.Refpos.X - besthit.Oldrefpos.X, besthit.Refpos.Y - besthit.Oldrefpos.Y };
				DVector3a hit = { {dl1.x + dl1.dx * bestfrac, dl1.y + dl1.dy * bestfrac, 0.},0. };

				R_AddInterpolationPoint(hit);
				if (port->mType == PORTT_LINKED)
				{
					hit.pos.X += port->mDisplacement.X;
					hit.pos.Y += port->mDisplacement.Y;
				}
				else
				{
					P_TranslatePortalXY(ld, hit.pos.X, hit.pos.Y);
					P_TranslatePortalZ(ld, hit.pos.Z);
					players[consoleplayer].viewz += hit.pos.Z;	// needs to be done here because otherwise the renderer will not catch the change.
					P_TranslatePortalAngle(ld, hit.angle);
				}
				R_AddInterpolationPoint(hit);
			}
			if (port->mType == PORTT_LINKED)
			{
				continue;
		}
		}
		break;
	}



	if (!portalcrossed)
	{
		// the move is ok, so link the thing into its new position
		FLinkContext ctx;
		thing->UnlinkFromWorld(&ctx);

		oldsector = thing->Sector;
		thing->floorz = tm.floorz;
		thing->ceilingz= tm.ceilingz;
		thing->dropoffz = tm.dropoffz;		// killough 11/98: keep track of dropoffs
		thing->floorpic = tm.floorpic;
		thing->floorterrain = tm.floorterrain;
		thing->floorsector = tm.floorsector;
		thing->ceilingpic = tm.ceilingpic;
		thing->ceilingsector = tm.ceilingsector;
		thing->SetXY(pos);

		thing->LinkToWorld(&ctx);
	}

	if (thing->flags2 & MF2_FLOORCLIP)
	{
		thing->AdjustFloorClip();
	}

	// if any special lines were hit, do the effect
	if (!(thing->flags & (MF_TELEPORT | MF_NOCLIP)))
	{
		spechit_t spec;
		DVector2 lastpos = thing->Pos();
		while (spechit.Pop(spec))
		{
			line_t *ld = spec.line;
			// see if the line was crossed

			side = P_PointOnLineSide(spec.Refpos, ld);
			oldside = P_PointOnLineSide(spec.Oldrefpos, ld);
			if (side != oldside && ld->special && !(thing->flags6 & MF6_NOTRIGGER))
			{
				if (thing->player && (thing->player->cheats & CF_PREDICTING))
				{
					P_PredictLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->player)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_Cross);
				}
				else if (thing->flags2 & MF2_MCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else if (thing->flags2 & MF2_PCROSS)
				{
					P_ActivateLine(ld, thing, oldside, SPAC_PCross);
				}
				else if ((ld->special == Teleport ||
					ld->special == Teleport_NoFog ||
					ld->special == Teleport_Line))
				{	// [RH] Just a little hack for BOOM compatibility
					P_ActivateLine(ld, thing, oldside, SPAC_MCross);
				}
				else
				{
					P_ActivateLine(ld, thing, oldside, SPAC_AnyCross);
				}
			}
		}
	}

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		thing->flags6 &= ~MF6_INTRYMOVE;
		return true;
	}

	// [RH] Check for crossing fake floor/ceiling
	newsec = thing->Sector;
	if (newsec->heightsec && oldsec->heightsec && newsec->SecActTarget)
	{
		const sector_t *hs = newsec->heightsec;
		double eyez = thing->Z() + viewheight;
		double fakez = hs->floorplane.ZatPoint(pos);

		if (!oldAboveFakeFloor && eyez > fakez)
		{ // View went above fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesSurface);
		}
		else if (oldAboveFakeFloor && eyez <= fakez)
		{ // View went below fake floor
			newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			fakez = hs->ceilingplane.ZatPoint(pos);
			if (!oldAboveFakeCeiling && eyez > fakez)
			{ // View went above fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesAboveC);
			}
			else if (oldAboveFakeCeiling && eyez <= fakez)
			{ // View went below fake ceiling
				newsec->SecActTarget->TriggerAction(thing, SECSPAC_EyesBelowC);
			}
		}
	}

	// If the actor stepped through a ceiling portal we need to reacquire the actual position info after the transition
	if (tm.portalstep)
	{
		FLinkContext ctx;
		DVector3 oldpos = thing->Pos();
		thing->UnlinkFromWorld(&ctx);
		thing->SetXYZ(thing->PosRelative(thing->Sector->GetOppositePortalGroup(sector_t::ceiling)));
		thing->Prev = thing->Pos() - oldpos;
		thing->Sector = P_PointInSector(thing->Pos());
		thing->PrevPortalGroup = thing->Sector->PortalGroup;
		thing->LinkToWorld(&ctx);

		P_FindFloorCeiling(thing);
	}

	// [RH] If changing sectors, trigger transitions
	thing->CheckSectorTransition(oldsec);
	thing->flags6 &= ~MF6_INTRYMOVE;
	return true;

pushline:
	thing->flags6 &= ~MF6_INTRYMOVE;

	// [RH] Don't activate anything if just predicting
	if (thing->player && (thing->player->cheats & CF_PREDICTING))
	{
		return false;
	}

	thing->SetZ(oldz);
	if (!(thing->flags&(MF_TELEPORT | MF_NOCLIP)))
	{
		int numSpecHitTemp;

		if (tm.thing->flags2 & MF2_BLASTED)
		{
			P_DamageMobj(tm.thing, NULL, NULL, tm.thing->Mass >> 5, NAME_Melee);
		}
		numSpecHitTemp = (int)spechit.Size();
		while (numSpecHitTemp > 0)
		{
			// see which lines were pushed
			spechit_t &spec = spechit[--numSpecHitTemp];
			side = P_PointOnLineSide(spec.Refpos, spec.line);
			CheckForPushSpecial(spec.line, side, thing, &spec.Refpos);
		}
	}
	return false;
}